

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall
t_perl_generator::generate_service_processor(t_perl_generator *this,t_service *tservice)

{
  int *piVar1;
  ofstream_with_content_based_conditional_update *poVar2;
  t_service *ptVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  pointer pptVar6;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_processor;
  string extends;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_178;
  string local_158;
  string local_138;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_118;
  allocator local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_118,&tservice->functions_
            );
  std::__cxx11::string::string((string *)&local_e0,"",local_100);
  std::__cxx11::string::string((string *)local_100,"",(allocator *)&bStack_178);
  ptVar3 = tservice->extends_;
  if (ptVar3 != (t_service *)0x0) {
    perl_namespace_abi_cxx11_(&local_158,this,(ptVar3->super_t_type).program_);
    iVar4 = (*(ptVar3->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar3);
    std::operator+(&bStack_178,&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar4));
    std::__cxx11::string::operator=((string *)&local_e0,(string *)&bStack_178);
    std::__cxx11::string::~string((string *)&bStack_178);
    std::__cxx11::string::~string((string *)&local_158);
    std::operator+(&local_158,"use base qw(",&local_e0);
    std::operator+(&bStack_178,&local_158,"Processor);");
    std::__cxx11::string::operator=((string *)local_100,(string *)&bStack_178);
    std::__cxx11::string::~string((string *)&bStack_178);
    std::__cxx11::string::~string((string *)&local_158);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar2 = &this->f_service_;
  poVar5 = std::operator<<((ostream *)poVar2,"package ");
  perl_namespace_abi_cxx11_
            (&bStack_178,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar5 = std::operator<<(poVar5,(string *)&bStack_178);
  poVar5 = std::operator<<(poVar5,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar5 = std::operator<<(poVar5,"Processor;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"use strict;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)local_100);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_178);
  if (local_e0._M_string_length == 0) {
    poVar5 = std::operator<<((ostream *)poVar2,"sub new {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&bStack_178,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)poVar2,(string *)&bStack_178);
    poVar5 = std::operator<<(poVar5,"my ($classname, $handler) = @_;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_158);
    poVar5 = std::operator<<(poVar5,"my $self      = {};");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&bStack_178);
    t_generator::indent_abi_cxx11_(&bStack_178,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)poVar2,(string *)&bStack_178);
    poVar5 = std::operator<<(poVar5,"$self->{handler} = $handler;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&bStack_178);
    t_generator::indent_abi_cxx11_(&bStack_178,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)poVar2,(string *)&bStack_178);
    poVar5 = std::operator<<(poVar5,"return bless ($self, $classname);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&bStack_178);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = std::operator<<((ostream *)poVar2,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  poVar5 = std::operator<<((ostream *)poVar2,"sub process {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&bStack_178,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)poVar2,(string *)&bStack_178);
  poVar5 = std::operator<<(poVar5,"my ($self, $input, $output) = @_;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_178);
  t_generator::indent_abi_cxx11_(&bStack_178,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)poVar2,(string *)&bStack_178);
  poVar5 = std::operator<<(poVar5,"my $rseqid = 0;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_158);
  poVar5 = std::operator<<(poVar5,"my $fname  = undef;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_138);
  poVar5 = std::operator<<(poVar5,"my $mtype  = 0;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&bStack_178);
  t_generator::indent_abi_cxx11_(&bStack_178,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)poVar2,(string *)&bStack_178);
  poVar5 = std::operator<<(poVar5,"$input->readMessageBegin(\\$fname, \\$mtype, \\$rseqid);");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_178);
  t_generator::indent_abi_cxx11_(&bStack_178,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)poVar2,(string *)&bStack_178);
  poVar5 = std::operator<<(poVar5,"my $methodname = \'process_\'.$fname;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_158);
  poVar5 = std::operator<<(poVar5,"if (!$self->can($methodname)) {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&bStack_178);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&bStack_178,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)poVar2,(string *)&bStack_178);
  poVar5 = std::operator<<(poVar5,"$input->skip(Thrift::TType::STRUCT);");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_158);
  poVar5 = std::operator<<(poVar5,"$input->readMessageEnd();");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_138);
  poVar5 = std::operator<<(poVar5,
                           "my $x = Thrift::TApplicationException->new(\'Function \'.$fname.\' not implemented.\', Thrift::TApplicationException::UNKNOWN_METHOD);"
                          );
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_40);
  poVar5 = std::operator<<(poVar5,
                           "$output->writeMessageBegin($fname, Thrift::TMessageType::EXCEPTION, $rseqid);"
                          );
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_60,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_60);
  poVar5 = std::operator<<(poVar5,"$x->write($output);");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_80);
  poVar5 = std::operator<<(poVar5,"$output->writeMessageEnd();");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_a0);
  poVar5 = std::operator<<(poVar5,"$output->getTransport()->flush();");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_c0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_c0);
  poVar5 = std::operator<<(poVar5,"return;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&bStack_178);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&bStack_178,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)poVar2,(string *)&bStack_178);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_158);
  poVar5 = std::operator<<(poVar5,"$self->$methodname($rseqid, $input, $output);");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_138);
  poVar5 = std::operator<<(poVar5,"return 1;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&bStack_178);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = std::operator<<((ostream *)poVar2,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  for (pptVar6 = local_118._M_impl.super__Vector_impl_data._M_start;
      pptVar6 != local_118._M_impl.super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    generate_process_function(this,tservice,*pptVar6);
  }
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_118);
  return;
}

Assistant:

void t_perl_generator::generate_service_processor(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  string extends = "";
  string extends_processor = "";
  t_service* extends_s = tservice->get_extends();
  if (extends_s != nullptr) {
    extends = perl_namespace(extends_s->get_program()) + extends_s->get_name();
    extends_processor = "use base qw(" + extends + "Processor);";
  }

  indent_up();

  // Generate the header portion
  f_service_ << "package " << perl_namespace(program_) << service_name_ << "Processor;" << endl
             << endl << "use strict;" << endl << extends_processor << endl << endl;

  if (extends.empty()) {
    f_service_ << "sub new {" << endl;

    indent_up();

    f_service_ << indent() << "my ($classname, $handler) = @_;" << endl << indent()
               << "my $self      = {};" << endl;

    f_service_ << indent() << "$self->{handler} = $handler;" << endl;

    f_service_ << indent() << "return bless ($self, $classname);" << endl;

    indent_down();

    f_service_ << "}" << endl << endl;
  }

  // Generate the server implementation
  f_service_ << "sub process {" << endl;
  indent_up();

  f_service_ << indent() << "my ($self, $input, $output) = @_;" << endl;

  f_service_ << indent() << "my $rseqid = 0;" << endl << indent() << "my $fname  = undef;" << endl
             << indent() << "my $mtype  = 0;" << endl << endl;

  f_service_ << indent() << "$input->readMessageBegin(\\$fname, \\$mtype, \\$rseqid);" << endl;

  // HOT: check for method implementation
  f_service_ << indent() << "my $methodname = 'process_'.$fname;" << endl << indent()
             << "if (!$self->can($methodname)) {" << endl;
  indent_up();

  f_service_ << indent() << "$input->skip(Thrift::TType::STRUCT);" << endl << indent()
             << "$input->readMessageEnd();" << endl << indent()
             << "my $x = Thrift::TApplicationException->new('Function '.$fname.' not implemented.', "
                "Thrift::TApplicationException::UNKNOWN_METHOD);" << endl << indent()
             << "$output->writeMessageBegin($fname, Thrift::TMessageType::EXCEPTION, $rseqid);" << endl
             << indent() << "$x->write($output);" << endl << indent()
             << "$output->writeMessageEnd();" << endl << indent()
             << "$output->getTransport()->flush();" << endl << indent() << "return;" << endl;

  indent_down();
  f_service_ << indent() << "}" << endl << indent()
             << "$self->$methodname($rseqid, $input, $output);" << endl << indent() << "return 1;"
             << endl;

  indent_down();

  f_service_ << "}" << endl << endl;

  // Generate the process subfunctions
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_process_function(tservice, *f_iter);
  }
}